

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O0

ImageList * __thiscall aeron::Subscription::removeAndCloseAllImages(Subscription *this)

{
  Image *pIVar1;
  ulong uVar2;
  ImageList *pIVar3;
  ImageList *this_00;
  atomic<aeron::ImageList_*> *__a;
  undefined8 uVar4;
  long in_RDI;
  ImageList *newImageList;
  size_t i;
  size_t length;
  Image *oldArray;
  ImageList *oldImageList;
  ulong local_28;
  
  uVar4 = 2;
  pIVar3 = std::atomic_load_explicit<aeron::ImageList*>
                     ((atomic<aeron::ImageList_*> *)(in_RDI + 0x50),memory_order_acquire);
  pIVar1 = pIVar3->m_images;
  uVar2 = pIVar3->m_length;
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    Image::close(pIVar1 + local_28,(int)uVar4);
  }
  this_00 = (ImageList *)operator_new(0x10);
  __a = (atomic<aeron::ImageList_*> *)operator_new__(8);
  (__a->_M_b)._M_p = (__pointer_type)0x0;
  ImageList::ImageList(this_00,(Image *)(__a + 1),0);
  std::atomic_store_explicit<aeron::ImageList*>(__a,this_00,memory_order_relaxed);
  std::atomic_store_explicit<bool>
            ((atomic<bool> *)__a,SUB81((ulong)this_00 >> 0x38,0),(memory_order)this_00);
  return pIVar3;
}

Assistant:

struct ImageList *removeAndCloseAllImages()
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image *oldArray = oldImageList->m_images;
        std::size_t length = oldImageList->m_length;

        for (std::size_t i = 0; i < length; i++)
        {
            oldArray[i].close();
        }

        auto newImageList = new struct ImageList(new Image[0], 0);

        std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);
        std::atomic_store_explicit(&m_isClosed, true, std::memory_order_release);

        return oldImageList;
    }